

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
::AssertHashEqConsistent<std::__cxx11::string>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort x;
  undefined1 (*pauVar6) [16];
  long lVar7;
  string_view v;
  size_t hash_of_arg;
  GroupPortableImpl local_60;
  ulong local_58;
  size_t local_50;
  anon_class_24_3_2b146c49 local_48;
  
  if (1 < *(ulong *)(this + 8)) {
    v._M_str = (key->_M_dataplus)._M_p;
    v._M_len = key->_M_string_length;
    local_50 = StringHash::operator()((StringHash *)this,v);
    uVar5 = *(ulong *)this;
    if (uVar5 < 0x11) {
      lVar7 = *(long *)(this + 0x18);
      local_48.hash_of_arg = &local_50;
      pauVar2 = *(undefined1 (**) [16])(this + 0x10);
      local_48.key = key;
      local_48.this =
           (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>_>_>
            *)this;
      if (uVar5 < 0xf) {
        if (8 < uVar5) {
          __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x753,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::ValueImpl<true>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
        local_60.ctrl = *(uint64_t *)(*pauVar2 + uVar5);
        local_60.ctrl = (uint64_t)GroupPortableImpl::MaskFull(&local_60);
        for (; local_60.ctrl != 0; local_60.ctrl = local_60.ctrl - 1 & local_60.ctrl) {
          uVar3 = NonIterableBitMask<unsigned_long,_8,_3>::LowestBitSet
                            ((NonIterableBitMask<unsigned_long,_8,_3> *)&local_60);
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>_>_>
          ::
          AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::anon_class_24_3_2b146c49::operator()
                    (&local_48,pauVar2[-1] + (ulong)uVar3 + 0xf,
                     (slot_type *)((ulong)uVar3 * 0x70 + lVar7 + -0x70));
        }
      }
      else {
        uVar5 = *(ulong *)(this + 8) >> 1;
        local_58 = uVar5;
        while (pauVar6 = pauVar2, uVar5 != 0) {
          auVar1 = *pauVar6;
          for (x = ~((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar1[0xf] >> 7) << 0xf); x != 0; x = x - 1 & x) {
            uVar3 = TrailingZeros<unsigned_short>(x);
            uVar4 = (ulong)uVar3;
            if ((char)(*pauVar6)[uVar4] < '\0') {
              __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x764,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::ValueImpl<true>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>_>_>
            ::
            AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::anon_class_24_3_2b146c49::operator()
                      (&local_48,*pauVar6 + uVar4,(slot_type *)(uVar4 * 0x70 + lVar7));
            uVar5 = uVar5 - 1;
          }
          lVar7 = lVar7 + 0x700;
          pauVar2 = pauVar6 + 1;
          if ((uVar5 != 0) && ((*pauVar6)[0xf] == -1)) {
            __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x76b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::ValueImpl<true>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
        if (local_58 < *(ulong *)(this + 8) >> 1) {
          __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x770,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::ValueImpl<true>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
      }
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }